

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O1

optional<unsigned_long> __thiscall
cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_find
          (utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,time_point now,peek peek)

{
  long lVar1;
  _Hash_node_base *element_idx;
  long lVar2;
  _Storage<unsigned_long,_true> _Var3;
  _Storage<unsigned_long,_true> extraout_RAX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  uint unaff_EBX;
  __off64_t *__offout;
  size_t in_R9;
  __node_base _Var5;
  optional<unsigned_long> oVar6;
  
  __offout = (__off64_t *)*key;
  _Var5._M_nxt = (_Hash_node_base *)0x0;
  _Var3 = (_Storage<unsigned_long,_true>)
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_find_before_node
                    ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 0x50),(ulong)__offout % *(ulong *)(this + 0x58),key,
                     (__hash_code)__offout);
  if ((__node_base_ptr)_Var3._M_value != (__node_base_ptr)0x0) {
    _Var5._M_nxt = *(_Hash_node_base **)_Var3;
  }
  if (_Var5._M_nxt == (_Hash_node_base *)0x0) {
    uVar4 = 0;
  }
  else {
    element_idx = _Var5._M_nxt[2]._M_nxt;
    lVar2 = *(long *)(*(long *)(this + 0x38) + (long)element_idx * 0x28);
    if ((long)now.__d.__r < lVar2) {
      lVar1 = *(long *)(this + 0x38) + (long)element_idx * 0x28;
      uVar4 = extraout_RDX;
      if (peek == no) {
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x88),
                   (int)*(undefined8 *)(this + 0x88),(__off64_t *)(this + 0x88),
                   (int)*(undefined8 *)(lVar1 + 0x10),__offout,in_R9,unaff_EBX);
        uVar4 = extraout_RDX_00;
      }
      _Var3 = (_Storage<unsigned_long,_true>)
              ((_Storage<unsigned_long,_true> *)(lVar1 + 0x20))->_M_value;
    }
    else {
      do_erase(this,(size_t)element_idx);
      _Var3 = extraout_RAX;
      uVar4 = extraout_RDX_01;
    }
    uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),(long)now.__d.__r < lVar2);
  }
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar4;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var3._M_value;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto do_find(const key_type& key, std::chrono::steady_clock::time_point now, peek peek) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];

            // Has the element TTL'ed?
            if (now < e.m_expire_time)
            {
                // Do not update items access if peeking.
                if (peek == peek::no)
                {
                    do_access(e);
                }
                return {e.m_value};
            }
            else
            {
                do_erase(element_idx);
            }
        }

        return {};
    }